

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_analyze_final(sat_solver *s,int hConf,int skip_first)

{
  int iVar1;
  int iVar2;
  lit lVar3;
  clause *pcVar4;
  lit *plVar5;
  int *piVar6;
  int local_54;
  int *lits;
  clause *c;
  lit q;
  int x_1;
  int x;
  int start;
  int j;
  int i;
  clause *conf;
  int skip_first_local;
  int hConf_local;
  sat_solver *s_local;
  
  pcVar4 = clause_read(s,hConf);
  veci_resize(&s->conf_final,0);
  if (s->root_level != 0) {
    iVar1 = veci_size(&s->tagged);
    if (iVar1 != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x365,"void sat_solver_analyze_final(sat_solver *, int, int)");
    }
    for (start = (int)(skip_first != 0); iVar1 = clause_size(pcVar4), start < iVar1;
        start = start + 1) {
      plVar5 = clause_begin(pcVar4);
      iVar1 = lit_var(plVar5[start]);
      iVar2 = var_level(s,iVar1);
      if (0 < iVar2) {
        var_set_tag(s,iVar1,1);
      }
    }
    iVar1 = s->root_level;
    iVar2 = veci_size(&s->trail_lim);
    if (iVar1 < iVar2) {
      piVar6 = veci_begin(&s->trail_lim);
      local_54 = piVar6[s->root_level];
    }
    else {
      local_54 = s->qtail + -1;
    }
    for (start = local_54; piVar6 = veci_begin(&s->trail_lim), *piVar6 <= start; start = start + -1)
    {
      iVar1 = lit_var(s->trail[start]);
      iVar2 = var_tag(s,iVar1);
      if (iVar2 != 0) {
        if (s->reasons[iVar1] == 0) {
          iVar1 = var_level(s,iVar1);
          if (iVar1 < 1) {
            __assert_fail("var_level(s, x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x374,"void sat_solver_analyze_final(sat_solver *, int, int)");
          }
          lVar3 = lit_neg(s->trail[start]);
          veci_push(&s->conf_final,lVar3);
        }
        else {
          iVar2 = clause_is_lit(s->reasons[iVar1]);
          if (iVar2 == 0) {
            pcVar4 = clause_read(s,s->reasons[iVar1]);
            plVar5 = clause_begin(pcVar4);
            for (x = 1; iVar1 = clause_size(pcVar4), x < iVar1; x = x + 1) {
              iVar1 = lit_var(plVar5[x]);
              iVar1 = var_level(s,iVar1);
              if (0 < iVar1) {
                iVar1 = lit_var(plVar5[x]);
                var_set_tag(s,iVar1,1);
              }
            }
          }
          else {
            lVar3 = clause_read_lit(s->reasons[iVar1]);
            iVar1 = lit_var(lVar3);
            if ((iVar1 < 0) || (iVar1 = lit_var(lVar3), s->size <= iVar1)) {
              __assert_fail("lit_var(q) >= 0 && lit_var(q) < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0x379,"void sat_solver_analyze_final(sat_solver *, int, int)");
            }
            iVar1 = lit_var(lVar3);
            iVar1 = var_level(s,iVar1);
            if (0 < iVar1) {
              iVar1 = lit_var(lVar3);
              var_set_tag(s,iVar1,1);
            }
          }
        }
      }
    }
    solver2_clear_tags(s,0);
  }
  return;
}

Assistant:

static void sat_solver_analyze_final(sat_solver* s, int hConf, int skip_first)
{
    clause* conf = clause_read(s, hConf);
    int i, j, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return;
    assert( veci_size(&s->tagged) == 0 );
//    assert( s->tags[lit_var(p)] == l_Undef );
//    s->tags[lit_var(p)] = l_True;
    for (i = skip_first ? 1 : 0; i < clause_size(conf); i++)
    {
        int x = lit_var(clause_begin(conf)[i]);
        if (var_level(s, x) > 0)
            var_set_tag(s, x, 1);
    }

    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = start; i >= (veci_begin(&s->trail_lim))[0]; i--){
        int x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            if (s->reasons[x] == 0){
                assert(var_level(s, x) > 0);
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }else{
                if (clause_is_lit(s->reasons[x])){
                    lit q = clause_read_lit(s->reasons[x]);
                    assert(lit_var(q) >= 0 && lit_var(q) < s->size);
                    if (var_level(s, lit_var(q)) > 0)
                        var_set_tag(s, lit_var(q), 1);
                }
                else{
                    clause* c = clause_read(s, s->reasons[x]);
                    int* lits = clause_begin(c);
                    for (j = 1; j < clause_size(c); j++)
                        if (var_level(s, lit_var(lits[j])) > 0)
                            var_set_tag(s, lit_var(lits[j]), 1);
                }
            }
        }
    }
    solver2_clear_tags(s,0);
}